

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void regenerate(ImGuiWS *imguiWS,int time)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  long lVar4;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> texture0;
  
  std::vector<char,_std::allocator<char>_>::vector(&texture0,0x100,&local_39);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    iVar1 = rand();
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = (char)iVar1;
  }
  ImGuiWS::setTexture(imguiWS,g_texture0Id,Gray8,0x10,0x10,
                      texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&texture0.super__Vector_base<char,_std::allocator<char>_>);
  std::vector<char,_std::allocator<char>_>::vector(&texture0,0xc00,&local_39);
  iVar1 = time;
  iVar3 = time;
  iVar2 = time;
  for (lVar4 = 0; lVar4 != 0xc00; lVar4 = lVar4 + 3) {
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = (char)(iVar2 % 0xff);
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4 + 1] = (char)((long)iVar3 % 0xff);
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4 + 2] = (char)(iVar1 % 0xff);
    iVar1 = iVar1 + 0x13;
    iVar3 = iVar3 + 0xd;
    iVar2 = iVar2 + 10;
  }
  ImGuiWS::setTexture(imguiWS,g_texture1Id,RGB24,0x20,0x20,
                      texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&texture0.super__Vector_base<char,_std::allocator<char>_>);
  std::vector<char,_std::allocator<char>_>::vector(&texture0,0x4000,&local_39);
  for (lVar4 = 0; lVar4 != 0x1000; lVar4 = lVar4 + 1) {
    iVar1 = rand();
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4 * 4] = (char)iVar1;
    iVar1 = rand();
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4 * 4 + 1] = (char)iVar1;
    iVar1 = rand();
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4 * 4 + 2] = (char)iVar1;
    texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4 * 4 + 3] = (char)(time % 0xff);
    time = time + 0x13;
  }
  ImGuiWS::setTexture(imguiWS,g_texture2Id,RGBA32,0x40,0x40,
                      texture0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&texture0.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void regenerate(ImGuiWS & imguiWS, int time) {
    {
        // texture sizes must be powers of 2
        int width = 16;
        int height = 16;
        std::vector<char> texture0(width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[i] = rand()%256;
        }
        imguiWS.setTexture(g_texture0Id, ImGuiWS::Texture::Type::Gray8, width, height, (const char *) texture0.data());
    }

    {
        int width = 32;
        int height = 32;
        std::vector<char> texture0(3*width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[3*i + 0] = (i*10 + time)%255;
            texture0[3*i + 1] = (i*13 + time)%255;
            texture0[3*i + 2] = (i*19 + time)%255;
        }
        imguiWS.setTexture(g_texture1Id, ImGuiWS::Texture::Type::RGB24, width, height, (const char *) texture0.data());
    }

    {
        int width = 64;
        int height = 64;
        std::vector<char> texture0(4*width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[4*i + 0] = rand()%256;
            texture0[4*i + 1] = rand()%256;
            texture0[4*i + 2] = rand()%256;
            texture0[4*i + 3] = (i*19 + time)%255;
        }
        imguiWS.setTexture(g_texture2Id, ImGuiWS::Texture::Type::RGBA32, width, height, (const char *) texture0.data());
    }
}